

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O2

void __thiscall amrex::AllPrint::AllPrint(AllPrint *this,ostream *os_)

{
  Print::Print(&this->super_Print,-1,os_);
  return;
}

Assistant:

explicit AllPrint (std::ostream& os_ = amrex::OutStream())
            : Print(Print::AllProcs, os_)
            {}